

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

_Bool Curl_cf_is_http2(Curl_cfilter *cf,Curl_easy *data)

{
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  data_local = (Curl_easy *)cf;
  while( true ) {
    if (data_local == (Curl_easy *)0x0) {
      return false;
    }
    if (*(Curl_cftype **)data_local == &Curl_cft_nghttp2) break;
    if ((*(uint *)(*(long *)data_local + 8) & 1) != 0) {
      return false;
    }
    data_local = (Curl_easy *)data_local->id;
  }
  return true;
}

Assistant:

static bool Curl_cf_is_http2(struct Curl_cfilter *cf,
                             const struct Curl_easy *data)
{
  (void)data;
  for(; cf; cf = cf->next) {
    if(cf->cft == &Curl_cft_nghttp2)
      return TRUE;
    if(cf->cft->flags & CF_TYPE_IP_CONNECT)
      return FALSE;
  }
  return FALSE;
}